

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O3

void anon_unknown.dwarf_b35c3::AssertUint64Equals(uint64_t expected,char *s)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  uint64_t actual;
  Message local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertHelper local_30;
  uint64_t local_28;
  uint64_t local_20;
  
  local_48.ss_.ptr_._0_4_ = 0;
  local_20 = expected;
  sVar3 = strlen(s);
  local_30.data_._0_4_ = wabt::ParseUint64(s,s + sVar3,&local_28);
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            (local_40,"Result::Ok","ParseUint64(s, s + strlen(s), &actual)",(Enum *)&local_48,
             (Result *)&local_30);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message(&local_48);
    lVar1 = CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_);
    if (s == (char *)0x0) {
      s = "(null)";
      sVar3 = 6;
    }
    else {
      sVar3 = strlen(s);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar1 + 0x10),s,sVar3);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-literal.cc"
               ,0x90,pcVar4);
    testing::internal::AssertHelper::operator=(&local_30,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (((CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) + 8))();
    }
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_40,"expected","actual",&local_20,&local_28);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message(&local_48);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-literal.cc"
                 ,0x91,pcVar4);
      testing::internal::AssertHelper::operator=(&local_30,&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if (((CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) != 0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         ((long *)CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

void AssertUint64Equals(uint64_t expected, const char* s) {
  uint64_t actual;
  ASSERT_EQ(Result::Ok, ParseUint64(s, s + strlen(s), &actual)) << s;
  ASSERT_EQ(expected, actual);
}